

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDD::NodeIntStateScatter
          (ChNodeFEAxyzDD *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T)

{
  double *local_e0;
  undefined8 local_d8;
  ChState *local_c8;
  ulong local_c0;
  long local_b0;
  ChVector<double> local_a8;
  ChVector<double> local_90;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  local_c0 = (ulong)off_x;
  local_e0 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             local_c0;
  local_b0 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_d8 = 3;
  local_c8 = x;
  if ((long)local_c0 <= local_b0 + -3) {
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_a8,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_e0,(type *)0x0);
    if ((ChVector<double> *)
        &(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x20 != &local_a8)
    {
      *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x20 =
           local_a8.m_data[0];
      *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x28 = local_a8.m_data[1];
      *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x30 = local_a8.m_data[2];
    }
    local_c0 = (ulong)(off_x + 3);
    local_e0 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               local_c0;
    local_b0 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_d8 = 3;
    local_c8 = x;
    if ((long)local_c0 <= local_b0 + -3) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_e0,(type *)0x0);
      if ((ChVector<double> *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0xf0 !=
          &local_48) {
        *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0xf0 = local_48.m_data[0];
        *(double *)&(this->super_ChNodeFEAxyzD).field_0xf8 = local_48.m_data[1];
        *(double *)&(this->super_ChNodeFEAxyzD).field_0x100 = local_48.m_data[2];
      }
      local_c0 = (ulong)(off_x + 6);
      local_e0 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 local_c0;
      local_b0 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_d8 = 3;
      local_c8 = x;
      if ((long)local_c0 <= local_b0 + -3) {
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&local_60,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_e0,(type *)0x0);
        if ((ChVector<double> *)&(this->super_ChNodeFEAxyzD).field_0x140 != &local_60) {
          *(double *)&(this->super_ChNodeFEAxyzD).field_0x140 = local_60.m_data[0];
          *(double *)&this->field_0x148 = local_60.m_data[1];
          *(double *)&this->field_0x150 = local_60.m_data[2];
        }
        local_c0 = (ulong)off_v;
        local_e0 = (v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   local_c0;
        local_b0 = (v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        local_d8 = 3;
        local_c8 = (ChState *)v;
        if ((long)local_c0 <= local_b0 + -3) {
          ChVector<double>::
          ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                    (&local_a8,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_e0,(type *)0x0);
          if ((ChVector<double> *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x38 !=
              &local_a8) {
            *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x38 =
                 local_a8.m_data[0];
            *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x40 =
                 local_a8.m_data[1];
            *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x48 =
                 local_a8.m_data[2];
          }
          local_c0 = (ulong)(off_v + 3);
          local_e0 = (v->super_ChVectorDynamic<double>).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     + local_c0;
          local_b0 = (v->super_ChVectorDynamic<double>).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
          local_d8 = 3;
          local_c8 = (ChState *)v;
          if ((long)local_c0 <= local_b0 + -3) {
            ChVector<double>::
            ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                      (&local_78,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&local_e0,(type *)0x0);
            if (&(this->super_ChNodeFEAxyzD).D_dt != &local_78) {
              (this->super_ChNodeFEAxyzD).D_dt.m_data[0] = local_78.m_data[0];
              (this->super_ChNodeFEAxyzD).D_dt.m_data[1] = local_78.m_data[1];
              (this->super_ChNodeFEAxyzD).D_dt.m_data[2] = local_78.m_data[2];
            }
            local_c0 = (ulong)(off_v + 6);
            local_e0 = (v->super_ChVectorDynamic<double>).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + local_c0;
            local_b0 = (v->super_ChVectorDynamic<double>).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
            local_d8 = 3;
            local_c8 = (ChState *)v;
            if ((long)local_c0 <= local_b0 + -3) {
              ChVector<double>::
              ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                        (&local_90,
                         (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_e0,(type *)0x0);
              if (&this->DD_dt != &local_90) {
                (this->DD_dt).m_data[0] = local_90.m_data[0];
                (this->DD_dt).m_data[1] = local_90.m_data[1];
                (this->DD_dt).m_data[2] = local_90.m_data[2];
              }
              return;
            }
          }
        }
      }
    }
  }
  local_d8 = 3;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzDD::NodeIntStateScatter(const unsigned int off_x,
                                         const ChState& x,
                                         const unsigned int off_v,
                                         const ChStateDelta& v,
                                         const double T) {
    SetPos(x.segment(off_x, 3));
    SetD(x.segment(off_x + 3, 3));
    SetDD(x.segment(off_x + 6, 3));

    SetPos_dt(v.segment(off_v, 3));
    SetD_dt(v.segment(off_v + 3, 3));
    SetDD_dt(v.segment(off_v + 6, 3));
}